

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLCommon.cpp
# Opt level: O1

void __thiscall ODDLParser::Property::~Property(Property *this)

{
  Text *pTVar1;
  Value *this_00;
  Reference *this_01;
  Property *this_02;
  
  pTVar1 = this->m_key;
  if (pTVar1 != (Text *)0x0) {
    if (pTVar1->m_buffer != (char *)0x0) {
      operator_delete__(pTVar1->m_buffer);
    }
    pTVar1->m_capacity = 0;
    pTVar1->m_len = 0;
    pTVar1->m_buffer = (char *)0x0;
    operator_delete(pTVar1);
  }
  this_00 = this->m_value;
  if (this_00 != (Value *)0x0) {
    Value::~Value(this_00);
    operator_delete(this_00);
  }
  this_01 = this->m_ref;
  if (this_01 != (Reference *)0x0) {
    Reference::~Reference(this_01);
    operator_delete(this_01);
  }
  this_02 = this->m_next;
  if (this_02 != (Property *)0x0) {
    ~Property(this_02);
    operator_delete(this_02);
    return;
  }
  return;
}

Assistant:

Property::~Property() {
    delete m_key;
    if(m_value!=ddl_nullptr)
        delete m_value;
    if(m_ref!=ddl_nullptr)
        delete(m_ref);
    if(m_next!=ddl_nullptr)
        delete m_next;
}